

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CESkyCoord.cpp
# Opt level: O3

void __thiscall CESkyCoord::CESkyCoord(CESkyCoord *this,CECoordinates *other)

{
  CECoordinateType CVar1;
  CEAngle CStack_38;
  double local_28;
  
  this->_vptr_CESkyCoord = (_func_int **)&PTR__CESkyCoord_00166cc0;
  CEAngle::CEAngle(&this->xcoord_);
  CEAngle::CEAngle(&this->ycoord_);
  local_28 = CppEphem::julian_date_J2000();
  (*other->_vptr_CECoordinates[3])(&CStack_38,other);
  CEAngle::operator=(&this->xcoord_,&CStack_38);
  CEAngle::~CEAngle(&CStack_38);
  local_28 = CppEphem::julian_date_J2000();
  (*other->_vptr_CECoordinates[4])(&CStack_38,other);
  CEAngle::operator=(&this->ycoord_,&CStack_38);
  CEAngle::~CEAngle(&CStack_38);
  CVar1 = CECoordinates::GetCoordSystem(other);
  this->coord_type_ = CVar1;
  return;
}

Assistant:

CESkyCoord::CESkyCoord(const CECoordinates& other)
{
    // Set coordinates
    xcoord_ = other.XCoord();
    ycoord_ = other.YCoord();
    coord_type_ = CESkyCoordType(int(other.GetCoordSystem()));
}